

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_c_pkzb.c
# Opt level: O0

void func_exc_pol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                 xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double __x;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t542;
  double t541;
  double t538;
  double t537;
  double t536;
  double t535;
  double t532;
  double t531;
  double t530;
  double t529;
  double t528;
  double t527;
  double t526;
  double t525;
  double t524;
  double t523;
  double t521;
  double t519;
  double t518;
  double t517;
  double t516;
  double t515;
  double t513;
  double t512;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t505;
  double t502;
  double t500;
  double t496;
  double t495;
  double t493;
  double t492;
  double t491;
  double t488;
  double t483;
  double t479;
  double t478;
  double t475;
  double t470;
  double t468;
  double t467;
  double t466;
  double t465;
  double t464;
  double t463;
  double t462;
  double t461;
  double t460;
  double t459;
  double t458;
  double t457;
  double t456;
  double t454;
  double t453;
  double t450;
  double t448;
  double t445;
  double t442;
  double t441;
  double t439;
  double t437;
  double t436;
  double t431;
  double t430;
  double t429;
  double t428;
  double t427;
  double t424;
  double t423;
  double t421;
  double t420;
  double t419;
  double t418;
  double t417;
  double t416;
  double t415;
  double t414;
  double t413;
  double t412;
  double t410;
  double t409;
  double t408;
  double t407;
  double t405;
  double t401;
  double t400;
  double t398;
  double t397;
  double t394;
  double t388;
  double t387;
  double t386;
  double t383;
  double t378;
  double t374;
  double t373;
  double t370;
  double t365;
  double t363;
  double t361;
  double t360;
  double t357;
  double t355;
  double t353;
  double t351;
  double t348;
  double t347;
  double t345;
  double t343;
  double t341;
  double t340;
  double t339;
  double t338;
  double t333;
  double t332;
  double t331;
  double t330;
  double t329;
  double t328;
  double t325;
  double t324;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t304;
  double t303;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t291;
  double t285;
  double t284;
  double t283;
  double t280;
  double t275;
  double t271;
  double t270;
  double t267;
  double t262;
  double t260;
  double t259;
  double t255;
  double t253;
  double t251;
  double t250;
  double t247;
  double t245;
  double t243;
  double t242;
  double t241;
  double t240;
  double t239;
  double t238;
  double t237;
  double t236;
  double t234;
  double t231;
  double t230;
  double t228;
  double t226;
  double t224;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t216;
  double t215;
  double t214;
  double t212;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t202;
  double t201;
  double t199;
  double t198;
  double t196;
  double t195;
  double t194;
  double t193;
  double t192;
  double t191;
  double t187;
  double t184;
  double t181;
  double t180;
  double t178;
  double t177;
  double t175;
  double t173;
  double t172;
  double t169;
  double t168;
  double t166;
  double t163;
  double t160;
  double t157;
  double t156;
  double t154;
  double t153;
  double t151;
  double t150;
  double t147;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t134;
  double t133;
  double t132;
  double t130;
  double t127;
  double t126;
  double t125;
  double t123;
  double t122;
  double t121;
  double t120;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t110;
  double t109;
  double t105;
  double t104;
  double t102;
  double t101;
  double t99;
  double t98;
  double t97;
  double t96;
  double t95;
  double t94;
  double t93;
  double t92;
  double t88;
  double t85;
  double t82;
  double t81;
  double t79;
  double t78;
  double t76;
  double t74;
  double t73;
  double t72;
  double t69;
  double t68;
  double t66;
  double t63;
  double t60;
  double t57;
  double t56;
  double t54;
  double t53;
  double t51;
  double t50;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t40;
  double t39;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t30;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t17;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double t3;
  double local_b48;
  double local_b40;
  double local_b30;
  double local_b20;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  bool local_ac1;
  double local_ac0;
  double local_ab8;
  double local_ab0;
  double local_aa8;
  double local_aa0;
  double local_a98;
  bool local_a89;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = *in_RDX - in_RDX[1];
  __x = *in_RDX + in_RDX[1];
  dVar5 = dVar4 * (1.0 / __x);
  dVar6 = dVar5 + 1.0;
  dVar7 = (double)(dVar6 <= (double)in_RDI[0x31]);
  local_a89 = *in_RDX <= (double)in_RDI[0x30] || dVar7 != 0.0;
  dVar8 = (double)local_a89;
  dVar9 = cbrt(0.3183098861837907);
  dVar10 = dVar9 * 2.519842099789747 * 1.2599210498948732;
  dVar11 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_b20 = cbrt((double)in_RDI[0x31]);
  local_b48 = local_b20 * (double)in_RDI[0x31];
  local_a98 = local_b48;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_a98 = 2.5198420997897464;
  }
  dVar12 = cbrt(__x);
  dVar13 = cbrt(1.0 / dVar6);
  dVar14 = cbrt(9.0);
  dVar14 = dVar14 * dVar14 * dVar9 * dVar9 * (double)in_RDI[4] * 1.4422495703074083;
  dVar15 = (1.0 / dVar12) * 1.2599210498948732;
  local_aa0 = local_b20;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa0 = 1.2599210498948732;
  }
  local_ab0 = (dVar14 * dVar15 * dVar13 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ab0;
  dVar11 = (double)(1.35 < local_ab0);
  local_aa8 = local_ab0;
  if ((dVar11 == 0.0) && (!NAN(dVar11))) {
    local_aa8 = 1.35;
  }
  local_aa8 = local_aa8 * local_aa8;
  dVar16 = local_aa8 * local_aa8;
  dVar17 = dVar16 * dVar16;
  if ((dVar11 != 0.0) || (NAN(dVar11))) {
    local_ab0 = 1.35;
  }
  dVar11 = sqrt(3.141592653589793);
  dVar18 = erf((1.0 / local_ab0) / 2.0);
  dVar19 = exp(-(1.0 / (local_ab0 * local_ab0)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ab8 = (((((((1.0 / local_aa8) / 36.0 - (1.0 / dVar16) / 960.0) +
                    (1.0 / (dVar16 * local_aa8)) / 26880.0) - (1.0 / dVar17) / 829440.0) +
                  ((1.0 / dVar17) / local_aa8) / 28385280.0) -
                 ((1.0 / dVar17) / dVar16) / 1073479680.0) +
                ((1.0 / dVar17) / (dVar16 * local_aa8)) / 44590694400.0) -
                (1.0 / (dVar17 * dVar17)) / 2021444812800.0;
  }
  else {
    local_ab8 = -(local_ab0 * 2.6666666666666665) *
                (local_ab0 * 2.0 *
                 (-(local_ab0 * local_ab0 * 2.0) * (dVar19 - 1.0) + (dVar19 - 1.5)) +
                dVar11 * dVar18) + 1.0;
  }
  dVar16 = *pdVar1;
  dVar17 = pdVar1[1];
  dVar18 = *in_RCX;
  dVar20 = *in_RDX * *in_RDX;
  dVar21 = cbrt(*in_RDX);
  dVar22 = (1.0 / (dVar21 * dVar21)) / dVar20;
  dVar23 = *in_RCX * dVar22;
  dVar19 = pdVar1[2];
  dVar24 = cbrt(9.869604401089358);
  dVar24 = dVar24 * dVar24 * 3.3019272488946267;
  dVar25 = dVar24 * 0.3;
  dVar21 = *in_R9 * ((1.0 / (dVar21 * dVar21)) / *in_RDX);
  dVar26 = dVar25 - dVar21;
  dVar27 = dVar25 + dVar21;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_ac0 = 0.0;
  }
  else {
    local_ac0 = dVar6 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar13) * local_ab8 *
                (dVar19 * dVar26 * (1.0 / dVar27) +
                dVar17 * dVar18 * 0.003840616724010807 * dVar22 *
                (1.0 / (dVar23 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  dVar5 = 1.0 - dVar5;
  dVar13 = (double)(dVar5 <= (double)in_RDI[0x31]);
  local_ac1 = in_RDX[1] <= (double)in_RDI[0x30] || dVar13 != 0.0;
  dVar18 = (double)local_ac1;
  dVar28 = cbrt(1.0 / dVar5);
  local_ad8 = (dVar14 * dVar15 * dVar28 * (1.0 / local_aa0)) / 18.0;
  bVar2 = 1.35 <= local_ad8;
  dVar14 = (double)(1.35 < local_ad8);
  local_ad0 = local_ad8;
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    local_ad0 = 1.35;
  }
  local_ad0 = local_ad0 * local_ad0;
  dVar29 = local_ad0 * local_ad0;
  dVar30 = dVar29 * dVar29;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_ad8 = 1.35;
  }
  dVar14 = erf((1.0 / local_ad8) / 2.0);
  dVar31 = exp(-(1.0 / (local_ad8 * local_ad8)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_ae0 = (((((((1.0 / local_ad0) / 36.0 - (1.0 / dVar29) / 960.0) +
                    (1.0 / (dVar29 * local_ad0)) / 26880.0) - (1.0 / dVar30) / 829440.0) +
                  ((1.0 / dVar30) / local_ad0) / 28385280.0) -
                 ((1.0 / dVar30) / dVar29) / 1073479680.0) +
                ((1.0 / dVar30) / (dVar29 * local_ad0)) / 44590694400.0) -
                (1.0 / (dVar30 * dVar30)) / 2021444812800.0;
  }
  else {
    local_ae0 = -(local_ad8 * 2.6666666666666665) *
                (local_ad8 * 2.0 *
                 (-(local_ad8 * local_ad8 * 2.0) * (dVar31 - 1.0) + (dVar31 - 1.5)) +
                dVar11 * dVar14) + 1.0;
  }
  dVar11 = in_RCX[2];
  dVar14 = in_RDX[1] * in_RDX[1];
  dVar29 = cbrt(in_RDX[1]);
  dVar30 = (1.0 / (dVar29 * dVar29)) / dVar14;
  dVar31 = in_RCX[2] * dVar30;
  dVar32 = in_R9[1] * ((1.0 / (dVar29 * dVar29)) / in_RDX[1]);
  dVar29 = dVar25 - dVar32;
  dVar25 = dVar25 + dVar32;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_ae8 = 0.0;
  }
  else {
    local_ae8 = dVar5 * 1.4422495703074083 * dVar10 * -0.046875 *
                local_a98 * dVar12 *
                (1.0 / dVar28) * local_ae0 *
                (dVar19 * dVar29 * (1.0 / dVar25) +
                dVar17 * dVar11 * 0.003840616724010807 * dVar30 *
                (1.0 / (dVar31 * 0.003840616724010807 + 1.0)) + dVar16);
  }
  if ((dVar7 != 0.0) || (local_af0 = dVar6, NAN(dVar7))) {
    local_af0 = (double)in_RDI[0x31];
  }
  dVar10 = dVar9 * 1.4422495703074083 * 2.519842099789747;
  local_b20 = 1.0 / local_b20;
  dVar11 = cbrt(dVar6);
  local_af8 = local_b20;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_af8 = 1.0 / dVar11;
  }
  dVar16 = dVar10 * dVar15 * local_af8;
  dVar17 = sqrt(dVar16);
  dVar19 = sqrt(dVar16);
  dVar19 = dVar16 * dVar19;
  dVar28 = dVar9 * dVar9 * 2.080083823051904;
  dVar33 = dVar28 * 1.5874010519681996;
  dVar34 = 1.0 / (dVar12 * dVar12);
  dVar35 = dVar34 * 1.5874010519681996;
  dVar36 = dVar33 * dVar35 * local_af8 * local_af8;
  dVar37 = log(16.081979498692537 /
               (dVar36 * 0.123235 + dVar19 * 0.204775 + dVar17 * 3.79785 + dVar16 * 0.8969) + 1.0);
  dVar37 = (dVar16 * 0.053425 + 1.0) * 0.0621814 * dVar37;
  local_b08 = local_b48;
  if ((double)in_RDI[0x31] < 0.0) {
    local_b08 = 0.0;
  }
  dVar38 = ((local_a98 + local_b08) - 2.0) * 1.9236610509315362;
  dVar39 = log(32.16395899738507 /
               (dVar36 * 0.1562925 + dVar19 * 0.420775 + dVar17 * 7.05945 + dVar16 * 1.549425) + 1.0
              );
  dVar17 = log(29.608749977793437 /
               (dVar36 * 0.1241775 + dVar19 * 0.1100325 + dVar17 * 5.1785 + dVar16 * 0.905775) + 1.0
              );
  dVar17 = (dVar16 * 0.0278125 + 1.0) * dVar17;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_b10 = 0.0;
  }
  else {
    local_b10 = (local_af0 *
                (dVar38 * 0.0197516734986138 * dVar17 +
                dVar38 * (dVar17 * -0.0197516734986138 +
                         (dVar16 * 0.05137 + 1.0) * -0.0310907 * dVar39 + dVar37) + -dVar37)) / 2.0;
  }
  dVar8 = pdVar1[3];
  dVar16 = *in_RCX;
  dVar37 = dVar23 * 0.46914023462026644 + 1.0;
  dVar17 = pdVar1[4];
  dVar19 = pdVar1[5];
  dVar39 = dVar26 * dVar26;
  dVar40 = dVar27 * dVar27;
  dVar36 = pdVar1[6];
  dVar41 = *in_RCX * *in_RCX;
  dVar41 = dVar41 * dVar41 * dVar41;
  dVar20 = dVar20 * dVar20 * dVar20 * dVar20;
  dVar42 = 1.0 / (dVar20 * dVar20);
  dVar43 = dVar37 * dVar37;
  dVar43 = (1.0 / (dVar43 * dVar43)) / dVar43;
  dVar20 = pdVar1[7];
  if ((dVar13 != 0.0) || (local_b18 = dVar5, NAN(dVar13))) {
    local_b18 = (double)in_RDI[0x31];
  }
  dVar44 = cbrt(dVar5);
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b20 = 1.0 / dVar44;
  }
  dVar10 = dVar10 * dVar15 * local_b20;
  dVar15 = sqrt(dVar10);
  dVar45 = sqrt(dVar10);
  dVar45 = dVar10 * dVar45;
  dVar33 = dVar33 * dVar35 * local_b20 * local_b20;
  dVar35 = log(16.081979498692537 /
               (dVar33 * 0.123235 + dVar45 * 0.204775 + dVar15 * 3.79785 + dVar10 * 0.8969) + 1.0);
  dVar35 = (dVar10 * 0.053425 + 1.0) * 0.0621814 * dVar35;
  dVar46 = log(32.16395899738507 /
               (dVar33 * 0.1562925 + dVar45 * 0.420775 + dVar15 * 7.05945 + dVar10 * 1.549425) + 1.0
              );
  dVar15 = log(29.608749977793437 /
               (dVar33 * 0.1241775 + dVar45 * 0.1100325 + dVar15 * 5.1785 + dVar10 * 0.905775) + 1.0
              );
  dVar15 = (dVar10 * 0.0278125 + 1.0) * dVar15;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    local_b30 = 0.0;
  }
  else {
    local_b30 = (local_b18 *
                (dVar38 * 0.0197516734986138 * dVar15 +
                dVar38 * (dVar15 * -0.0197516734986138 +
                         (dVar10 * 0.05137 + 1.0) * -0.0310907 * dVar46 + dVar35) + -dVar35)) / 2.0;
  }
  dVar10 = in_RCX[2];
  dVar15 = dVar31 * 0.46914023462026644 + 1.0;
  dVar18 = dVar29 * dVar29;
  dVar33 = dVar25 * dVar25;
  dVar35 = in_RCX[2] * in_RCX[2];
  dVar35 = dVar35 * dVar35 * dVar35;
  dVar14 = dVar14 * dVar14 * dVar14 * dVar14;
  dVar14 = 1.0 / (dVar14 * dVar14);
  dVar38 = dVar15 * dVar15;
  dVar38 = (1.0 / (dVar38 * dVar38)) / dVar38;
  dVar9 = dVar9 * 1.4422495703074083 * 2.519842099789747 * (1.0 / dVar12);
  dVar12 = sqrt(dVar9);
  dVar45 = sqrt(dVar9);
  dVar45 = dVar9 * dVar45;
  dVar34 = dVar28 * 1.5874010519681996 * dVar34;
  dVar28 = log(16.081979498692537 /
               (dVar34 * 0.123235 + dVar45 * 0.204775 + dVar12 * 3.79785 + dVar9 * 0.8969) + 1.0);
  dVar28 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar28;
  local_b40 = local_b48;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_b40 = dVar11 * dVar6;
  }
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    local_b48 = dVar44 * dVar5;
  }
  dVar5 = ((local_b40 + local_b48) - 2.0) * 1.9236610509315362;
  dVar13 = log(32.16395899738507 /
               (dVar34 * 0.1562925 + dVar45 * 0.420775 + dVar12 * 7.05945 + dVar9 * 1.549425) + 1.0)
  ;
  dVar12 = log(29.608749977793437 /
               (dVar34 * 0.1241775 + dVar45 * 0.1100325 + dVar12 * 5.1785 + dVar9 * 0.905775) + 1.0)
  ;
  dVar12 = (dVar9 * 0.0278125 + 1.0) * dVar12;
  dVar6 = pdVar1[9];
  dVar24 = dVar24 * 0.3 * (dVar21 + dVar32);
  dVar32 = dVar21 * 2.0 * dVar32;
  dVar21 = dVar24 - dVar32;
  dVar21 = dVar21 * dVar21;
  dVar24 = dVar24 + dVar32;
  dVar24 = dVar24 * dVar24;
  dVar7 = pdVar1[10];
  dVar32 = dVar21 * dVar21 * dVar21;
  dVar34 = (1.0 / (dVar24 * dVar24)) / dVar24;
  dVar11 = pdVar1[0xb];
  dVar23 = sqrt(dVar23 + dVar31);
  dVar23 = cbrt(dVar23 * 1.4142135623730951);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_ac0 + local_ae8 +
         local_b10 *
         (dVar20 * dVar39 * dVar39 * (1.0 / (dVar40 * dVar40)) * 0.010661445329398458 * dVar41 *
          dVar42 * dVar43 +
         dVar36 * dVar41 * 0.010661445329398458 * dVar42 * dVar43 +
         dVar19 * dVar39 * (1.0 / dVar40) +
         dVar8 * dVar16 * 0.46914023462026644 * dVar22 * (1.0 / dVar37) +
         dVar17 * dVar26 * (1.0 / dVar27)) +
         local_b30 *
         (dVar20 * dVar18 * dVar18 * (1.0 / (dVar33 * dVar33)) * 0.010661445329398458 * dVar35 *
          dVar14 * dVar38 +
         dVar36 * dVar35 * 0.010661445329398458 * dVar14 * dVar38 +
         dVar19 * dVar18 * (1.0 / dVar33) +
         dVar8 * dVar10 * 0.46914023462026644 * dVar30 * (1.0 / dVar15) +
         dVar17 * dVar29 * (1.0 / dVar25)) +
         (((dVar5 * 0.0197516734986138 * dVar12 +
           dVar4 * dVar4 * dVar4 * dVar4 * (1.0 / (__x * __x * __x * __x)) *
           dVar5 * (dVar12 * -0.0197516734986138 +
                   (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar13 + dVar28) + -dVar28) - local_b10) -
         local_b30) *
         (dVar7 * dVar32 * dVar34 + dVar6 * dVar21 * (1.0 / dVar24) + pdVar1[8] +
          (dVar11 * dVar32 * dVar34 * 1.2599210498948732 * dVar23 * dVar23) / 2.0 +
         (pdVar1[0xc] * dVar21 * (1.0 / dVar24) * 1.2599210498948732 * dVar23 * dVar23) / 2.0) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_pol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, const double *lapl, const double *tau, xc_mgga_out_params *out)
{
  double t2, t3, t4, t6, t7, t8, t9, t10;
  double t11, t12, t13, t14, t15, t16, t18, t19;
  double t20, t22, t23, t24, t25, t26, t27, t28;
  double t30, t31, t33, t34, t37, t38, t40, t41;
  double t42, t45, t46, t47, t48, t49, t50, t51;
  double t52, t53, t54, t55, t57, t58, t61, t63;
  double t64, t65, t66, t67, t68, t69, t71, t74;
  double t75, t77, t78, t79, t80, t81, t82, t83;
  double t84, t85, t86, t87, t88, t89, t90, t91;
  double t92, t93, t94, t95, t98, t99, t101, t106;
  double t109, t110, t114, t119, t122, t123, t124, t126;
  double t127, t128, t130, t131, t132, t133, t134, t135;
  double t136, t137, t138, t139, t140, t142, t143, t144;
  double t146, t148, t149, t151, t153, t154, t155, t158;
  double t160, t161, t162, t164, t165, t166, t167, t168;
  double t170, t171, t173, t174, t175, t176, t177, t178;
  double t179, t180, t183, t184, t187, t188, t191, t192;
  double t195, t196, t197, t198, t199, t200, t201, t203;
  double t204, t205, t206, t207, t208, t210, t212, t213;
  double t216, t218, t219, t220, t222, t224, t227, t228;
  double t230, t231, t233, t234, t235, t237, t239, t244;
  double t247, t248, t252, t257, t260, t261, t262, t265;
  double t267, t268, t269, t271, t272, t273, t274, t275;
  double t276, t277, t279, t284, t285, t287, t288, t289;
  double t290, t291, t292, t294, t295, t296, t297, t299;
  double t300, t301, t302, t303, t306, t307, t310, t311;
  double t314, t315, t318, t319, t322, t323, t325, t326;
  double t327, t328, t329, t330, t332, t333, t334, t336;
  double t338, t339, t342, t344, t346, t348, t351, t352;
  double t354, t356, t361, t364, t365, t369, t374, t377;
  double t378, t379, t382, t384, t385, t386, t388, t394;
  double t395, t396, t397, t398, t399, t401, t402, t404;
  double t405, t406, t407, t410, t411, t414, t415, t418;
  double t419, t422, t423, t426, t427, t429, tzk0;


  t2 = rho[0] * rho[0];
  t3 = POW_1_3(rho[0]);
  t4 = t3 * t3;
  t6 = 0.1e1 / t4 / t2;
  t7 = sigma[0] * t6;
  t8 = rho[0] - rho[1];
  t9 = rho[0] + rho[1];
  t10 = 0.1e1 / t9;
  t11 = t8 * t10;
  t12 = 0.1e1 + t11;
  t13 = t12 / 0.2e1;
  t14 = POW_1_3(t13);
  t15 = t14 * t14;
  t16 = t15 * t13;
  t18 = rho[1] * rho[1];
  t19 = POW_1_3(rho[1]);
  t20 = t19 * t19;
  t22 = 0.1e1 / t20 / t18;
  t23 = sigma[2] * t22;
  t24 = 0.1e1 - t11;
  t25 = t24 / 0.2e1;
  t26 = POW_1_3(t25);
  t27 = t26 * t26;
  t28 = t27 * t25;
  t30 = t16 * t7 + t23 * t28;
  t31 = t30 * t30;
  t33 = 0.1e1 / t4 / rho[0];
  t34 = tau[0] * t33;
  t37 = 0.1e1 / t20 / rho[1];
  t38 = tau[1] * t37;
  t40 = t16 * t34 + t28 * t38;
  t41 = t40 * t40;
  t42 = 0.1e1 / t41;
  t45 = 0.1e1 + 0.828125e-2 * t31 * t42;
  t46 = M_CBRT3;
  t47 = 0.1e1 / M_PI;
  t48 = POW_1_3(t47);
  t49 = t46 * t48;
  t50 = M_CBRT4;
  t51 = t50 * t50;
  t52 = POW_1_3(t9);
  t53 = 0.1e1 / t52;
  t54 = t51 * t53;
  t55 = t49 * t54;
  t57 = 0.1e1 + 0.53425e-1 * t55;
  t58 = sqrt(t55);
  t61 = POW_3_2(t55);
  t63 = t46 * t46;
  t64 = t48 * t48;
  t65 = t63 * t64;
  t66 = t52 * t52;
  t67 = 0.1e1 / t66;
  t68 = t50 * t67;
  t69 = t65 * t68;
  t71 = 0.379785e1 * t58 + 0.8969e0 * t55 + 0.204775e0 * t61 + 0.123235e0 * t69;
  t74 = 0.1e1 + 0.16081979498692535067e2 / t71;
  t75 = log(t74);
  t77 = 0.621814e-1 * t57 * t75;
  t78 = t8 * t8;
  t79 = t78 * t78;
  t80 = t9 * t9;
  t81 = t80 * t80;
  t82 = 0.1e1 / t81;
  t83 = t79 * t82;
  t84 = t12 <= p->zeta_threshold;
  t85 = POW_1_3(p->zeta_threshold);
  t86 = t85 * p->zeta_threshold;
  t87 = POW_1_3(t12);
  t88 = t87 * t12;
  t89 = my_piecewise3(t84, t86, t88);
  t90 = t24 <= p->zeta_threshold;
  t91 = POW_1_3(t24);
  t92 = t91 * t24;
  t93 = my_piecewise3(t90, t86, t92);
  t94 = t89 + t93 - 0.2e1;
  t95 = M_CBRT2;
  t98 = 0.1e1 / (0.2e1 * t95 - 0.2e1);
  t99 = t94 * t98;
  t101 = 0.1e1 + 0.5137e-1 * t55;
  t106 = 0.705945e1 * t58 + 0.1549425e1 * t55 + 0.420775e0 * t61 + 0.1562925e0 * t69;
  t109 = 0.1e1 + 0.32163958997385070134e2 / t106;
  t110 = log(t109);
  t114 = 0.1e1 + 0.278125e-1 * t55;
  t119 = 0.51785e1 * t58 + 0.905775e0 * t55 + 0.1100325e0 * t61 + 0.1241775e0 * t69;
  t122 = 0.1e1 + 0.29608749977793437516e2 / t119;
  t123 = log(t122);
  t124 = t114 * t123;
  t126 = -0.310907e-1 * t101 * t110 + t77 - 0.19751673498613801407e-1 * t124;
  t127 = t99 * t126;
  t128 = t83 * t127;
  t130 = 0.19751673498613801407e-1 * t99 * t124;
  t131 = log(0.2e1);
  t132 = 0.1e1 - t131;
  t133 = M_PI * M_PI;
  t134 = 0.1e1 / t133;
  t135 = t132 * t134;
  t136 = t85 * t85;
  t137 = t87 * t87;
  t138 = my_piecewise3(t84, t136, t137);
  t139 = t91 * t91;
  t140 = my_piecewise3(t90, t136, t139);
  t142 = t138 / 0.2e1 + t140 / 0.2e1;
  t143 = t142 * t142;
  t144 = t143 * t142;
  t146 = sigma[0] + 0.2e1 * sigma[1] + sigma[2];
  t148 = 0.1e1 / t52 / t80;
  t149 = t146 * t148;
  t151 = 0.1e1 / t143;
  t153 = 0.1e1 / t48;
  t154 = t153 * t50;
  t155 = t151 * t63 * t154;
  t158 = 0.1e1 / t132;
  t160 = (-t77 + t128 + t130) * t158;
  t161 = 0.1e1 / t144;
  t162 = t133 * t161;
  t164 = exp(-t160 * t162);
  t165 = t164 - 0.1e1;
  t166 = 0.1e1 / t165;
  t167 = t158 * t166;
  t168 = t146 * t146;
  t170 = 0.1e1 / t66 / t81;
  t171 = t168 * t170;
  t173 = t95 * t95;
  t174 = t143 * t143;
  t175 = 0.1e1 / t174;
  t176 = t173 * t175;
  t177 = 0.1e1 / t64;
  t178 = t46 * t177;
  t179 = t178 * t51;
  t180 = t176 * t179;
  t183 = t149 * t95 * t155 / 0.96e2 + 0.21437009059034868486e-3 * t167 * t171 * t180;
  t184 = t183 * t158;
  t187 = 0.1e1 + 0.65854491829355115987e0 * t167 * t183;
  t188 = 0.1e1 / t187;
  t191 = 0.1e1 + 0.65854491829355115987e0 * t184 * t188;
  t192 = log(t191);
  t195 = t135 * t144 * t192 + t128 + t130 - t77;
  t196 = t45 * t195;
  t197 = sigma[0] * sigma[0];
  t198 = 0.1e1 / t2;
  t199 = t197 * t198;
  t200 = tau[0] * tau[0];
  t201 = 0.1e1 / t200;
  t203 = rho[0] <= p->dens_threshold || t84;
  t204 = t49 * t51;
  t205 = t53 * t95;
  t206 = 0.1e1 / t85;
  t207 = 0.1e1 / t87;
  t208 = my_piecewise3(t84, t206, t207);
  t210 = t204 * t205 * t208;
  t212 = 0.1e1 + 0.53425e-1 * t210;
  t213 = sqrt(t210);
  t216 = POW_3_2(t210);
  t218 = t65 * t50;
  t219 = t67 * t173;
  t220 = t208 * t208;
  t222 = t218 * t219 * t220;
  t224 = 0.379785e1 * t213 + 0.8969e0 * t210 + 0.204775e0 * t216 + 0.123235e0 * t222;
  t227 = 0.1e1 + 0.16081979498692535067e2 / t224;
  t228 = log(t227);
  t230 = 0.621814e-1 * t212 * t228;
  t231 = 0.2e1 <= p->zeta_threshold;
  t233 = my_piecewise3(t231, t86, 0.2e1 * t95);
  t234 = 0.e0 <= p->zeta_threshold;
  t235 = my_piecewise3(t234, t86, 0);
  t237 = (t233 + t235 - 0.2e1) * t98;
  t239 = 0.1e1 + 0.5137e-1 * t210;
  t244 = 0.705945e1 * t213 + 0.1549425e1 * t210 + 0.420775e0 * t216 + 0.1562925e0 * t222;
  t247 = 0.1e1 + 0.32163958997385070134e2 / t244;
  t248 = log(t247);
  t252 = 0.1e1 + 0.278125e-1 * t210;
  t257 = 0.51785e1 * t213 + 0.905775e0 * t210 + 0.1100325e0 * t216 + 0.1241775e0 * t222;
  t260 = 0.1e1 + 0.29608749977793437516e2 / t257;
  t261 = log(t260);
  t262 = t252 * t261;
  t265 = t237 * (-0.310907e-1 * t239 * t248 + t230 - 0.19751673498613801407e-1 * t262);
  t267 = 0.19751673498613801407e-1 * t237 * t262;
  t268 = my_piecewise3(t231, t136, t173);
  t269 = my_piecewise3(t234, t136, 0);
  t271 = t268 / 0.2e1 + t269 / 0.2e1;
  t272 = t271 * t271;
  t273 = t272 * t271;
  t274 = 0.1e1 / t272;
  t275 = t274 * t63;
  t276 = t7 * t275;
  t277 = 0.1e1 / t208;
  t279 = t154 * t52 * t277;
  t284 = 0.1e1 / t273;
  t285 = t133 * t284;
  t287 = exp(-(-t230 + t265 + t267) * t158 * t285);
  t288 = t287 - 0.1e1;
  t289 = 0.1e1 / t288;
  t290 = t158 * t289;
  t291 = t2 * t2;
  t292 = t291 * rho[0];
  t294 = 0.1e1 / t3 / t292;
  t295 = t197 * t294;
  t296 = t272 * t272;
  t297 = 0.1e1 / t296;
  t299 = t290 * t295 * t297;
  t300 = t51 * t66;
  t301 = 0.1e1 / t220;
  t302 = t300 * t301;
  t303 = t178 * t302;
  t306 = t276 * t279 / 0.96e2 + 0.21437009059034868486e-3 * t299 * t303;
  t307 = t306 * t158;
  t310 = 0.1e1 + 0.65854491829355115987e0 * t290 * t306;
  t311 = 0.1e1 / t310;
  t314 = 0.1e1 + 0.65854491829355115987e0 * t307 * t311;
  t315 = log(t314);
  t318 = t135 * t273 * t315 - t230 + t265 + t267;
  t319 = my_piecewise3(t84, p->zeta_threshold, t12);
  t322 = my_piecewise3(t203, 0, t318 * t319 / 0.2e1);
  t323 = t201 * t322;
  t325 = 0.2390625e-1 * t199 * t323;
  t326 = sigma[2] * sigma[2];
  t327 = 0.1e1 / t18;
  t328 = t326 * t327;
  t329 = tau[1] * tau[1];
  t330 = 0.1e1 / t329;
  t332 = rho[1] <= p->dens_threshold || t90;
  t333 = 0.1e1 / t91;
  t334 = my_piecewise3(t90, t206, t333);
  t336 = t204 * t205 * t334;
  t338 = 0.1e1 + 0.53425e-1 * t336;
  t339 = sqrt(t336);
  t342 = POW_3_2(t336);
  t344 = t334 * t334;
  t346 = t218 * t219 * t344;
  t348 = 0.379785e1 * t339 + 0.8969e0 * t336 + 0.204775e0 * t342 + 0.123235e0 * t346;
  t351 = 0.1e1 + 0.16081979498692535067e2 / t348;
  t352 = log(t351);
  t354 = 0.621814e-1 * t338 * t352;
  t356 = 0.1e1 + 0.5137e-1 * t336;
  t361 = 0.705945e1 * t339 + 0.1549425e1 * t336 + 0.420775e0 * t342 + 0.1562925e0 * t346;
  t364 = 0.1e1 + 0.32163958997385070134e2 / t361;
  t365 = log(t364);
  t369 = 0.1e1 + 0.278125e-1 * t336;
  t374 = 0.51785e1 * t339 + 0.905775e0 * t336 + 0.1100325e0 * t342 + 0.1241775e0 * t346;
  t377 = 0.1e1 + 0.29608749977793437516e2 / t374;
  t378 = log(t377);
  t379 = t369 * t378;
  t382 = t237 * (-0.310907e-1 * t356 * t365 + t354 - 0.19751673498613801407e-1 * t379);
  t384 = 0.19751673498613801407e-1 * t237 * t379;
  t385 = t23 * t275;
  t386 = 0.1e1 / t334;
  t388 = t154 * t52 * t386;
  t394 = exp(-(-t354 + t382 + t384) * t158 * t285);
  t395 = t394 - 0.1e1;
  t396 = 0.1e1 / t395;
  t397 = t158 * t396;
  t398 = t18 * t18;
  t399 = t398 * rho[1];
  t401 = 0.1e1 / t19 / t399;
  t402 = t326 * t401;
  t404 = t397 * t402 * t297;
  t405 = 0.1e1 / t344;
  t406 = t300 * t405;
  t407 = t178 * t406;
  t410 = t385 * t388 / 0.96e2 + 0.21437009059034868486e-3 * t404 * t407;
  t411 = t410 * t158;
  t414 = 0.1e1 + 0.65854491829355115987e0 * t397 * t410;
  t415 = 0.1e1 / t414;
  t418 = 0.1e1 + 0.65854491829355115987e0 * t411 * t415;
  t419 = log(t418);
  t422 = t135 * t273 * t419 - t354 + t382 + t384;
  t423 = my_piecewise3(t90, p->zeta_threshold, t24);
  t426 = my_piecewise3(t332, 0, t422 * t423 / 0.2e1);
  t427 = t330 * t426;
  t429 = 0.2390625e-1 * t328 * t427;
  tzk0 = t196 - t325 - t429;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}